

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::DefaultPrintTo<std::array<int,10ul>>(long param_1,ostream *param_2)

{
  long lVar1;
  
  std::operator<<(param_2,'{');
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 4) {
    if (lVar1 != 0) {
      std::operator<<(param_2,',');
    }
    std::operator<<(param_2,' ');
    testing_internal::DefaultPrintNonContainerTo<int>((int *)(param_1 + lVar1),param_2);
  }
  std::operator<<(param_2,' ');
  std::operator<<(param_2,'}');
  return;
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}